

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMModule.c
# Opt level: O3

cs_err option(cs_struct *handle,cs_opt_type type,size_t value)

{
  return CS_ERR_OK;
}

Assistant:

static cs_err option(cs_struct *handle, cs_opt_type type, size_t value)
{
	switch(type) {
		case CS_OPT_MODE:
			if (value & CS_MODE_THUMB)
				handle->disasm = Thumb_getInstruction;
			else
				handle->disasm = ARM_getInstruction;

			handle->mode = (cs_mode)value;
			break;
		case CS_OPT_SYNTAX:
			ARM_getRegName(handle, (int)value);
			handle->syntax = (int)value;
			break;
		default:
			break;
	}

	return CS_ERR_OK;
}